

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::createSubgroupOperation
          (TGlslangToSpvTraverser *this,TOperator op,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy)

{
  uint uVar1;
  bool bVar2;
  IdImmediate IVar3;
  IdImmediate IVar4;
  IdImmediate IVar5;
  byte bVar6;
  byte bVar7;
  undefined4 uVar8;
  Id typeId_00;
  Id IVar9;
  Op OVar10;
  Op opCode;
  undefined4 in_register_00000034;
  Builder *this_00;
  uint uVar11;
  Id *pIVar12;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  IdImmediate groupOperand;
  IdImmediate executionScope;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> local_68;
  IdImmediate local_50;
  IdImmediate local_48;
  Id local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,op);
  uVar11 = op - EOpSubgroupElect;
  local_3c = typeId;
  switch(uVar11) {
  case 0:
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x3d);
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_68);
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x40);
    break;
  case 0xe:
  case 0xf:
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_68);
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x41);
    break;
  case 0x10:
  case 0x11:
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_68);
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x42);
    break;
  case 0x12:
  case 0x13:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_subgroup_rotate");
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x178a);
    break;
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_68);
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x3f);
    break;
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_68);
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x43);
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_68);
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x44);
    break;
  case 0x34:
  case 0x35:
    spv::Builder::addExtension(&this->builder,"SPV_KHR_quad_control");
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x13df);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_68);
  case 1:
  case 2:
  case 3:
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3d;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_68);
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x3e);
    break;
  default:
    __assert_fail("0 && \"Unhandled subgroup operation!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x2285,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator, spv::Id, std::vector<spv::Id> &, glslang::TBasicType)"
                 );
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_subgroup_partitioned");
    local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x14b1);
  }
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              *)&(this->builder).capabilities,(Capability *)&local_68);
  if (0x4b < uVar11) {
switchD_003c40c2_caseD_36:
    __assert_fail("0 && \"Unhandled subgroup operation!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x230a,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator, spv::Id, std::vector<spv::Id> &, glslang::TBasicType)"
                 );
  }
  uVar1 = typeProxy - EbtFloat;
  switch(uVar11) {
  case 0:
    bVar6 = 1;
    opCode = OpGroupNonUniformElect;
    break;
  case 1:
    bVar6 = 1;
    opCode = OpGroupNonUniformAll;
    break;
  case 2:
    bVar6 = 1;
    opCode = OpGroupNonUniformAny;
    break;
  case 3:
    bVar6 = 1;
    opCode = OpGroupNonUniformAllEqual;
    break;
  case 4:
    bVar6 = 1;
    opCode = OpGroupNonUniformBroadcast;
    break;
  case 5:
    bVar6 = 1;
    opCode = OpGroupNonUniformBroadcastFirst;
    break;
  case 6:
    bVar6 = 1;
    opCode = OpGroupNonUniformBallot;
    break;
  case 7:
    bVar6 = 1;
    opCode = OpGroupNonUniformInverseBallot;
    break;
  case 8:
    bVar6 = 1;
    opCode = OpGroupNonUniformBallotBitExtract;
    break;
  case 9:
  case 10:
  case 0xb:
    bVar6 = 1;
    opCode = OpGroupNonUniformBallotBitCount;
    break;
  case 0xc:
    bVar6 = 1;
    opCode = OpGroupNonUniformBallotFindLSB;
    break;
  case 0xd:
    bVar6 = 1;
    opCode = OpGroupNonUniformBallotFindMSB;
    break;
  case 0xe:
    bVar6 = 1;
    opCode = OpGroupNonUniformShuffle;
    break;
  case 0xf:
    bVar6 = 1;
    opCode = OpGroupNonUniformShuffleXor;
    break;
  case 0x10:
    bVar6 = 1;
    opCode = OpGroupNonUniformShuffleUp;
    break;
  case 0x11:
    bVar6 = 1;
    opCode = OpGroupNonUniformShuffleDown;
    break;
  case 0x12:
  case 0x13:
    bVar6 = 1;
    opCode = OpGroupNonUniformRotateKHR;
    break;
  default:
    bVar6 = 1;
    opCode = (uVar1 < 3) + OpGroupNonUniformIAdd;
    break;
  case 0x15:
  case 0x1c:
  case 0x23:
  case 0x2a:
  case 0x38:
  case 0x3f:
  case 0x46:
    bVar6 = 1;
    opCode = (uVar1 < 3) + OpGroupNonUniformIMul;
    break;
  case 0x16:
  case 0x1d:
  case 0x24:
  case 0x2b:
  case 0x39:
  case 0x40:
  case 0x47:
    OVar10 = ((typeProxy - EbtUint8 & 0xfffffff9) == 0) + OpGroupNonUniformSMin;
    opCode = OpGroupNonUniformFMin;
    goto LAB_003c4178;
  case 0x17:
  case 0x1e:
  case 0x25:
  case 0x2c:
  case 0x3a:
  case 0x41:
  case 0x48:
    OVar10 = ((typeProxy - EbtUint8 & 0xfffffff9) == 0) + OpGroupNonUniformSMax;
    opCode = OpGroupNonUniformFMax;
LAB_003c4178:
    bVar6 = 1;
    if (2 < uVar1) {
      opCode = OVar10;
    }
    break;
  case 0x18:
  case 0x1f:
  case 0x26:
  case 0x2d:
  case 0x3b:
  case 0x42:
  case 0x49:
    bVar6 = 1;
    opCode = (uint)(typeProxy == EbtBool) * 3 + OpGroupNonUniformBitwiseAnd;
    break;
  case 0x19:
  case 0x20:
  case 0x27:
  case 0x2e:
  case 0x3c:
  case 0x43:
  case 0x4a:
    bVar6 = 1;
    opCode = (uint)(typeProxy == EbtBool) * 3 + OpGroupNonUniformBitwiseOr;
    break;
  case 0x1a:
  case 0x21:
  case 0x28:
  case 0x2f:
  case 0x3d:
  case 0x44:
  case 0x4b:
    bVar6 = 1;
    opCode = (uint)(typeProxy == EbtBool) * 3 + OpGroupNonUniformBitwiseXor;
    break;
  case 0x30:
    bVar6 = 1;
    opCode = OpGroupNonUniformQuadBroadcast;
    break;
  case 0x31:
  case 0x32:
  case 0x33:
    bVar6 = 1;
    opCode = OpGroupNonUniformQuadSwap;
    break;
  case 0x34:
    bVar6 = 1;
    opCode = OpGroupNonUniformQuadAllKHR;
    bVar7 = 0;
    goto LAB_003c417e;
  case 0x35:
    opCode = OpGroupNonUniformQuadAnyKHR;
    bVar6 = 0;
    break;
  case 0x36:
    goto switchD_003c40c2_caseD_36;
  }
  bVar7 = 1;
LAB_003c417e:
  IVar9 = 0x7fffffff;
  bVar2 = true;
  switch((int)local_38) {
  case 0xcd:
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
    bVar2 = false;
    IVar9 = 0;
    goto switchD_003c41a3_caseD_d0;
  case 0xce:
  case 0xdf:
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
    IVar9 = 1;
    break;
  case 0xcf:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
    IVar9 = 2;
    break;
  default:
    goto switchD_003c41a3_caseD_d0;
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf3:
    IVar9 = 3;
    break;
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
  case 0x100:
  case 0x101:
    IVar9 = 6;
    break;
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x108:
    IVar9 = 7;
    break;
  case 0x109:
  case 0x10a:
  case 0x10b:
  case 0x10c:
  case 0x10d:
  case 0x10e:
  case 0x10f:
    IVar9 = 8;
  }
  bVar2 = false;
switchD_003c41a3_caseD_d0:
  local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_finish = (IdImmediate *)0x0;
  local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (IdImmediate *)0x0;
  this_00 = &this->builder;
  typeId_00 = spv::Builder::makeIntegerType(this_00,0x20,false);
  local_48.word = spv::Builder::makeIntConstant(this_00,typeId_00,3,false);
  local_48.isId = true;
  if ((bool)(bVar7 & bVar6)) {
    if (local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
      _M_realloc_insert<spv::IdImmediate_const&>
                ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_68,
                 (iterator)
                 local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_48);
    }
    else {
      IVar5.word = local_48.word;
      IVar5.isId = true;
      IVar5._1_3_ = local_48._1_3_;
      *local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
       super__Vector_impl_data._M_finish = IVar5;
      local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  uVar8 = local_50._0_4_;
  if (!bVar2) {
    local_50._0_4_ = local_50._0_4_ & 0xffffff00;
    local_50.word = IVar9;
    if (local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
      _M_realloc_insert<spv::IdImmediate_const&>
                ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_68,
                 (iterator)
                 local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_50);
    }
    else {
      *local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
       super__Vector_impl_data._M_finish = (IdImmediate)(CONCAT44(IVar9,uVar8) & 0xffffffffffffff00)
      ;
      local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  pIVar12 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pIVar12 !=
      (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_50.word = *pIVar12;
      local_50.isId = true;
      if (local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
        _M_realloc_insert<spv::IdImmediate_const&>
                  ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_50);
      }
      else {
        IVar3.word = local_50.word;
        IVar3.isId = true;
        IVar3._1_3_ = local_50._1_3_;
        *local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
         super__Vector_impl_data._M_finish = IVar3;
        local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pIVar12 = pIVar12 + 1;
    } while (pIVar12 !=
             (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  uVar11 = (int)local_38 - 0xf5;
  IVar9 = 0;
  if (uVar11 < 3) {
    IVar9 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar9 = spv::Builder::makeIntConstant(this_00,IVar9,uVar11,false);
  }
  if (IVar9 != 0) {
    local_50.isId = true;
    local_50.word = IVar9;
    if (local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
      _M_realloc_insert<spv::IdImmediate_const&>
                ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_68,
                 (iterator)
                 local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_50);
    }
    else {
      IVar4.word = IVar9;
      IVar4.isId = true;
      IVar4._1_3_ = local_50._1_3_;
      *local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
       super__Vector_impl_data._M_finish = IVar4;
      local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  IVar9 = spv::Builder::createOp(this_00,opCode,local_3c,&local_68);
  if (local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar9;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createSubgroupOperation(glslang::TOperator op, spv::Id typeId,
    std::vector<spv::Id>& operands, glslang::TBasicType typeProxy)
{
    // Add the required capabilities.
    switch (op) {
    case glslang::EOpSubgroupElect:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        break;
    case glslang::EOpSubgroupQuadAll:
    case glslang::EOpSubgroupQuadAny:
        builder.addExtension(spv::E_SPV_KHR_quad_control);
        builder.addCapability(spv::CapabilityQuadControlKHR);
        [[fallthrough]];
    case glslang::EOpSubgroupAll:
    case glslang::EOpSubgroupAny:
    case glslang::EOpSubgroupAllEqual:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformVote);
        break;
    case glslang::EOpSubgroupBroadcast:
    case glslang::EOpSubgroupBroadcastFirst:
    case glslang::EOpSubgroupBallot:
    case glslang::EOpSubgroupInverseBallot:
    case glslang::EOpSubgroupBallotBitExtract:
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupBallotFindLSB:
    case glslang::EOpSubgroupBallotFindMSB:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformBallot);
        break;
    case glslang::EOpSubgroupRotate:
    case glslang::EOpSubgroupClusteredRotate:
        builder.addExtension(spv::E_SPV_KHR_subgroup_rotate);
        builder.addCapability(spv::CapabilityGroupNonUniformRotateKHR);
        break;
    case glslang::EOpSubgroupShuffle:
    case glslang::EOpSubgroupShuffleXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformShuffle);
        break;
    case glslang::EOpSubgroupShuffleUp:
    case glslang::EOpSubgroupShuffleDown:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformShuffleRelative);
        break;
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
        break;
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupClusteredXor:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformClustered);
        break;
    case glslang::EOpSubgroupQuadBroadcast:
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:
        builder.addCapability(spv::CapabilityGroupNonUniform);
        builder.addCapability(spv::CapabilityGroupNonUniformQuad);
        break;
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedXor:
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        builder.addExtension(spv::E_SPV_NV_shader_subgroup_partitioned);
        builder.addCapability(spv::CapabilityGroupNonUniformPartitionedNV);
        break;
    default: assert(0 && "Unhandled subgroup operation!");
    }


    const bool isUnsigned = isTypeUnsignedInt(typeProxy);
    const bool isFloat = isTypeFloat(typeProxy);
    const bool isBool = typeProxy == glslang::EbtBool;

    spv::Op opCode = spv::OpNop;

    // Figure out which opcode to use.
    switch (op) {
    case glslang::EOpSubgroupElect:                   opCode = spv::OpGroupNonUniformElect; break;
    case glslang::EOpSubgroupQuadAll:                 opCode = spv::OpGroupNonUniformQuadAllKHR; break;
    case glslang::EOpSubgroupAll:                     opCode = spv::OpGroupNonUniformAll; break;
    case glslang::EOpSubgroupQuadAny:                 opCode = spv::OpGroupNonUniformQuadAnyKHR; break;
    case glslang::EOpSubgroupAny:                     opCode = spv::OpGroupNonUniformAny; break;
    case glslang::EOpSubgroupAllEqual:                opCode = spv::OpGroupNonUniformAllEqual; break;
    case glslang::EOpSubgroupBroadcast:               opCode = spv::OpGroupNonUniformBroadcast; break;
    case glslang::EOpSubgroupBroadcastFirst:          opCode = spv::OpGroupNonUniformBroadcastFirst; break;
    case glslang::EOpSubgroupBallot:                  opCode = spv::OpGroupNonUniformBallot; break;
    case glslang::EOpSubgroupInverseBallot:           opCode = spv::OpGroupNonUniformInverseBallot; break;
    case glslang::EOpSubgroupBallotBitExtract:        opCode = spv::OpGroupNonUniformBallotBitExtract; break;
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount: opCode = spv::OpGroupNonUniformBallotBitCount; break;
    case glslang::EOpSubgroupBallotFindLSB:           opCode = spv::OpGroupNonUniformBallotFindLSB; break;
    case glslang::EOpSubgroupBallotFindMSB:           opCode = spv::OpGroupNonUniformBallotFindMSB; break;
    case glslang::EOpSubgroupShuffle:                 opCode = spv::OpGroupNonUniformShuffle; break;
    case glslang::EOpSubgroupShuffleXor:              opCode = spv::OpGroupNonUniformShuffleXor; break;
    case glslang::EOpSubgroupShuffleUp:               opCode = spv::OpGroupNonUniformShuffleUp; break;
    case glslang::EOpSubgroupShuffleDown:             opCode = spv::OpGroupNonUniformShuffleDown; break;
    case glslang::EOpSubgroupRotate:
    case glslang::EOpSubgroupClusteredRotate:         opCode = spv::OpGroupNonUniformRotateKHR; break;
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFAdd;
        } else {
            opCode = spv::OpGroupNonUniformIAdd;
        }
        break;
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMul;
        } else {
            opCode = spv::OpGroupNonUniformIMul;
        }
        break;
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMin;
        } else if (isUnsigned) {
            opCode = spv::OpGroupNonUniformUMin;
        } else {
            opCode = spv::OpGroupNonUniformSMin;
        }
        break;
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
        if (isFloat) {
            opCode = spv::OpGroupNonUniformFMax;
        } else if (isUnsigned) {
            opCode = spv::OpGroupNonUniformUMax;
        } else {
            opCode = spv::OpGroupNonUniformSMax;
        }
        break;
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalAnd;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseAnd;
        }
        break;
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalOr;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseOr;
        }
        break;
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveXor:
    case glslang::EOpSubgroupClusteredXor:
    case glslang::EOpSubgroupPartitionedXor:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        if (isBool) {
            opCode = spv::OpGroupNonUniformLogicalXor;
        } else {
            opCode = spv::OpGroupNonUniformBitwiseXor;
        }
        break;
    case glslang::EOpSubgroupQuadBroadcast:      opCode = spv::OpGroupNonUniformQuadBroadcast; break;
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:   opCode = spv::OpGroupNonUniformQuadSwap; break;
    default: assert(0 && "Unhandled subgroup operation!");
    }

    // get the right Group Operation
    spv::GroupOperation groupOperation = spv::GroupOperationMax;
    switch (op) {
    default:
        break;
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
        groupOperation = spv::GroupOperationReduce;
        break;
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
        groupOperation = spv::GroupOperationInclusiveScan;
        break;
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
        groupOperation = spv::GroupOperationExclusiveScan;
        break;
    case glslang::EOpSubgroupClusteredAdd:
    case glslang::EOpSubgroupClusteredMul:
    case glslang::EOpSubgroupClusteredMin:
    case glslang::EOpSubgroupClusteredMax:
    case glslang::EOpSubgroupClusteredAnd:
    case glslang::EOpSubgroupClusteredOr:
    case glslang::EOpSubgroupClusteredXor:
        groupOperation = spv::GroupOperationClusteredReduce;
        break;
    case glslang::EOpSubgroupPartitionedAdd:
    case glslang::EOpSubgroupPartitionedMul:
    case glslang::EOpSubgroupPartitionedMin:
    case glslang::EOpSubgroupPartitionedMax:
    case glslang::EOpSubgroupPartitionedAnd:
    case glslang::EOpSubgroupPartitionedOr:
    case glslang::EOpSubgroupPartitionedXor:
        groupOperation = spv::GroupOperationPartitionedReduceNV;
        break;
    case glslang::EOpSubgroupPartitionedInclusiveAdd:
    case glslang::EOpSubgroupPartitionedInclusiveMul:
    case glslang::EOpSubgroupPartitionedInclusiveMin:
    case glslang::EOpSubgroupPartitionedInclusiveMax:
    case glslang::EOpSubgroupPartitionedInclusiveAnd:
    case glslang::EOpSubgroupPartitionedInclusiveOr:
    case glslang::EOpSubgroupPartitionedInclusiveXor:
        groupOperation = spv::GroupOperationPartitionedInclusiveScanNV;
        break;
    case glslang::EOpSubgroupPartitionedExclusiveAdd:
    case glslang::EOpSubgroupPartitionedExclusiveMul:
    case glslang::EOpSubgroupPartitionedExclusiveMin:
    case glslang::EOpSubgroupPartitionedExclusiveMax:
    case glslang::EOpSubgroupPartitionedExclusiveAnd:
    case glslang::EOpSubgroupPartitionedExclusiveOr:
    case glslang::EOpSubgroupPartitionedExclusiveXor:
        groupOperation = spv::GroupOperationPartitionedExclusiveScanNV;
        break;
    }

    // build the instruction
    std::vector<spv::IdImmediate> spvGroupOperands;

    // Every operation begins with the Execution Scope operand.
    spv::IdImmediate executionScope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
    // All other ops need the execution scope. Quad Control Ops don't need scope, it's always Quad.
    if (opCode != spv::OpGroupNonUniformQuadAllKHR && opCode != spv::OpGroupNonUniformQuadAnyKHR) {
        spvGroupOperands.push_back(executionScope);
    }

    // Next, for all operations that use a Group Operation, push that as an operand.
    if (groupOperation != spv::GroupOperationMax) {
        spv::IdImmediate groupOperand = { false, (unsigned)groupOperation };
        spvGroupOperands.push_back(groupOperand);
    }

    // Push back the operands next.
    for (auto opIt = operands.cbegin(); opIt != operands.cend(); ++opIt) {
        spv::IdImmediate operand = { true, *opIt };
        spvGroupOperands.push_back(operand);
    }

    // Some opcodes have additional operands.
    spv::Id directionId = spv::NoResult;
    switch (op) {
    default: break;
    case glslang::EOpSubgroupQuadSwapHorizontal: directionId = builder.makeUintConstant(0); break;
    case glslang::EOpSubgroupQuadSwapVertical:   directionId = builder.makeUintConstant(1); break;
    case glslang::EOpSubgroupQuadSwapDiagonal:   directionId = builder.makeUintConstant(2); break;
    }
    if (directionId != spv::NoResult) {
        spv::IdImmediate direction = { true, directionId };
        spvGroupOperands.push_back(direction);
    }

    return builder.createOp(opCode, typeId, spvGroupOperands);
}